

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_common.cpp
# Opt level: O0

int CfdGetSupportedFunction(uint64_t *support_flag)

{
  uint64_t uVar1;
  uint64_t *in_RDI;
  CfdException *except;
  undefined4 local_4;
  
  cfd::Initialize();
  if (in_RDI != (uint64_t *)0x0) {
    uVar1 = cfd::GetSupportedFunction();
    *in_RDI = uVar1;
  }
  local_4 = (uint)(in_RDI == (uint64_t *)0x0);
  return local_4;
}

Assistant:

int CfdGetSupportedFunction(uint64_t* support_flag) {
  try {
    cfd::Initialize();
    if (support_flag == nullptr) return kCfdIllegalArgumentError;
    *support_flag = cfd::GetSupportedFunction();
    return kCfdSuccess;
  } catch (const CfdException& except) {
    return except.GetErrorCode();
  } catch (...) {
    return kCfdUnknownError;
  }
}